

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::startRead(TcpConnection *this)

{
  EventLoop *this_00;
  TcpConnection *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  Functor local_30;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  this_00 = this->m_loop;
  local_58 = startReadInLoop;
  local_50 = 0;
  local_60 = this;
  local_10 = this;
  std::bind<void(sznet::net::TcpConnection::*)(),sznet::net::TcpConnection*>
            (&local_48,(offset_in_TcpConnection_to_subr *)&local_58,&local_60);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_30,&local_48);
  EventLoop::runInLoop(this_00,&local_30);
  std::function<void_()>::~function(&local_30);
  return;
}

Assistant:

void TcpConnection::startRead()
{
	m_loop->runInLoop(std::bind(&TcpConnection::startReadInLoop, this));
}